

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

SparseAllocationBuilder * __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::addMemoryBind
          (SparseAllocationBuilder *this,deUint32 numChunks)

{
  deUint32 dVar1;
  reference pvVar2;
  undefined1 local_24 [8];
  MemoryBind memoryBind;
  deUint32 numChunks_local;
  SparseAllocationBuilder *this_local;
  
  local_24._0_4_ = this->m_allocationNdx;
  local_24._4_4_ = this->m_resourceChunkNdx;
  memoryBind.allocationNdx = this->m_memoryChunkNdx;
  memoryBind.resourceChunkNdx = numChunks;
  memoryBind.memoryChunkNdx = numChunks;
  unique0x10000096 = this;
  std::
  vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ::push_back(&this->m_memoryBinds,(value_type *)local_24);
  dVar1 = memoryBind.memoryChunkNdx;
  this->m_resourceChunkNdx = memoryBind.memoryChunkNdx + this->m_resourceChunkNdx;
  this->m_memoryChunkNdx = memoryBind.memoryChunkNdx + this->m_memoryChunkNdx;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_chunksPerAllocation,(ulong)this->m_allocationNdx);
  *pvVar2 = dVar1 + *pvVar2;
  return this;
}

Assistant:

SparseAllocationBuilder& SparseAllocationBuilder::addMemoryBind (const deUint32 numChunks)
{
	const MemoryBind memoryBind =
	{
		m_allocationNdx,
		m_resourceChunkNdx,
		m_memoryChunkNdx,
		numChunks
	};
	m_memoryBinds.push_back(memoryBind);

	m_resourceChunkNdx						+= numChunks;
	m_memoryChunkNdx						+= numChunks;
	m_chunksPerAllocation[m_allocationNdx]	+= numChunks;

	return *this;
}